

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<unsigned_long>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,unsigned_long *args)

{
  format_args args_00;
  string_view fmt_00;
  string_view_t msg;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  unsigned_long *args_01;
  appender out;
  buffer<char> *pbVar1;
  char *in_RDI;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long> *in_R8;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  buffer<char> *in_stack_fffffffffffffb88;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  logger *in_stack_fffffffffffffb98;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffba0;
  unsigned_long_long in_stack_fffffffffffffbc8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  size_t in_stack_fffffffffffffbe0;
  level_enum lvl_00;
  log_msg *this_01;
  size_t in_stack_fffffffffffffc10;
  string_view_t in_stack_fffffffffffffc18;
  source_loc in_stack_fffffffffffffc30;
  basic_string_view<char> local_358 [2];
  char *local_338;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_330;
  log_msg *local_328;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_2c0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long>
  *local_2b8 [2];
  undefined8 local_2a8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long>
  **local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  allocator<char> local_269;
  buffer<char> local_268 [9];
  undefined1 local_142;
  byte local_141;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long> *local_140
  ;
  undefined8 local_128;
  undefined8 uStack_120;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long> **local_40
  ;
  undefined8 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long> **local_30
  ;
  undefined8 local_28;
  undefined8 *local_20;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long> **local_18
  ;
  
  this_01 = (log_msg *)&stack0x00000008;
  local_140 = in_R8;
  local_128 = in_RDX;
  uStack_120 = in_RCX;
  local_141 = should_log(in_stack_fffffffffffffb98,
                         (level_enum)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  local_142 = details::backtracer::enabled((backtracer *)0x53c6a1);
  if (((local_141 & 1) != 0) || ((bool)local_142)) {
    lvl_00 = (level_enum)((ulong)&local_269 >> 0x20);
    std::allocator<char>::allocator();
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffb90,(allocator<char> *)in_stack_fffffffffffffb88);
    std::allocator<char>::~allocator(&local_269);
    pbVar1 = local_268;
    ::fmt::v9::appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    local_298 = local_128;
    uStack_290 = uStack_120;
    local_2b8[0] = ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,unsigned_long&>
                             (local_140,(v9 *)pbVar1,args_01);
    local_38 = &local_2a8;
    local_40 = local_2b8;
    local_28 = 4;
    local_2a8 = 4;
    fmt_00.data_._4_4_ = in_stack_fffffffffffffbdc;
    fmt_00.data_._0_4_ = in_stack_fffffffffffffbd8;
    fmt_00.size_ = in_stack_fffffffffffffbe0;
    args_00.field_1.values_ = in_stack_fffffffffffffbd0.values_;
    args_00.desc_ = in_stack_fffffffffffffbc8;
    local_30 = local_40;
    local_20 = local_38;
    local_18 = local_40;
    local_2a0 = local_40;
    local_2c0.container =
         (buffer<char> *)::fmt::v9::vformat_to<fmt::v9::appender,_0>(out,fmt_00,args_00);
    local_328 = *(log_msg **)&this_01->level;
    local_338 = (this_01->logger_name).data_;
    pbStack_330 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)
                  (this_01->logger_name).size_;
    ::fmt::v9::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffb90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb88);
    pbVar1 = local_268;
    s = ::fmt::v9::detail::buffer<char>::data(pbVar1);
    count = ::fmt::v9::detail::buffer<char>::size(pbVar1);
    ::fmt::v9::basic_string_view<char>::basic_string_view(local_358,s,count);
    msg.size_ = in_stack_fffffffffffffc10;
    msg.data_ = in_RDI;
    this_00 = pbStack_330;
    log_msg_00 = local_328;
    details::log_msg::log_msg
              (this_01,in_stack_fffffffffffffc30,in_stack_fffffffffffffc18,lvl_00,msg);
    log_it_(in_stack_fffffffffffffba0,log_msg_00,SUB81((ulong)this_00 >> 0x38,0),
            SUB81((ulong)this_00 >> 0x30,0));
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (this_00);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }